

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future_std.h
# Opt level: O0

unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_> __thiscall
prometheus::detail::make_unique<prometheus::Exposer,char_const(&)[12]>
          (detail *this,char (*args) [12])

{
  char (*pacVar1) [12];
  Exposer *this_00;
  allocator local_39;
  string local_38;
  char (*local_18) [12];
  char (*args_local) [12];
  
  local_18 = args;
  args_local = (char (*) [12])this;
  this_00 = (Exposer *)operator_new(0x48);
  pacVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,*pacVar1,&local_39);
  Exposer::Exposer(this_00,&local_38,2,(CivetCallbacks *)0x0);
  std::unique_ptr<prometheus::Exposer,std::default_delete<prometheus::Exposer>>::
  unique_ptr<std::default_delete<prometheus::Exposer>,void>
            ((unique_ptr<prometheus::Exposer,std::default_delete<prometheus::Exposer>> *)this,
             this_00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return (__uniq_ptr_data<prometheus::Exposer,_std::default_delete<prometheus::Exposer>,_true,_true>
         )(__uniq_ptr_data<prometheus::Exposer,_std::default_delete<prometheus::Exposer>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}